

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pose.h
# Opt level: O0

Matrix33d * gmath::getRotation(Vector6d *pose)

{
  SVector<double,_6> *in_RSI;
  SMatrix<double,_3,_3> *in_RDI;
  SVector<double,_3> *a;
  double dVar1;
  double v2;
  double phi;
  Vector3d n;
  double in_stack_00000280;
  Vector3d *in_stack_00000288;
  SVector<double,_3> *in_stack_ffffffffffffffb8;
  SVector<double,_3> local_28;
  SVector<double,_6> *local_10;
  
  local_10 = in_RSI;
  a = (SVector<double,_3> *)SVector<double,_6>::operator[](in_RSI,3);
  dVar1 = SVector<double,_6>::operator[](local_10,4);
  v2 = SVector<double,_6>::operator[](local_10,5);
  SVector<double,_3>::SVector(&local_28,(double)a,dVar1,v2);
  dVar1 = norm<double,3>(a);
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    SVector<double,_3>::operator/(in_stack_ffffffffffffffb8,(double)a);
    createR(in_stack_00000288,in_stack_00000280);
  }
  else {
    SMatrix<double,_3,_3>::SMatrix(in_RDI);
  }
  return in_RDI;
}

Assistant:

inline Matrix33d getRotation(const Vector6d &pose)
{
  Vector3d n(pose[3], pose[4], pose[5]);
  double phi=norm(n);

  if (phi != 0)
  {
    return createR(n/phi, phi);
  }

  return Matrix33d();
}